

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O0

void __thiscall
MockNamedValueComparatorsAndCopiersRepository::clear
          (MockNamedValueComparatorsAndCopiersRepository *this)

{
  MockNamedValueComparatorsAndCopiersRepositoryNode *pMVar1;
  MockNamedValueComparatorsAndCopiersRepositoryNode *this_00;
  MockNamedValueComparatorsAndCopiersRepositoryNode *next;
  MockNamedValueComparatorsAndCopiersRepository *this_local;
  
  while (this->head_ != (MockNamedValueComparatorsAndCopiersRepositoryNode *)0x0) {
    pMVar1 = this->head_->next_;
    this_00 = this->head_;
    if (this_00 != (MockNamedValueComparatorsAndCopiersRepositoryNode *)0x0) {
      MockNamedValueComparatorsAndCopiersRepositoryNode::
      ~MockNamedValueComparatorsAndCopiersRepositoryNode(this_00);
      operator_delete(this_00,0x28);
    }
    this->head_ = pMVar1;
  }
  return;
}

Assistant:

void MockNamedValueComparatorsAndCopiersRepository::clear()
{
    while (head_) {
        MockNamedValueComparatorsAndCopiersRepositoryNode* next = head_->next_;
        delete head_;
        head_ = next;
    }
}